

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O2

int do_copy(int nargs,char **args)

{
  int iVar1;
  int __fd;
  uint uVar2;
  ssize_t sVar3;
  int iVar4;
  int iVar5;
  void *__buf;
  void *__buf_00;
  void *__ptr;
  ulong uVar6;
  stat info;
  
  if (nargs != 3) {
    return -1;
  }
  iVar1 = stat(args[1],(stat *)&info);
  if (iVar1 < 0) {
    return -1;
  }
  __ptr = (void *)0x0;
  __fd = open(args[1],0);
  iVar4 = -1;
  iVar1 = iVar4;
  if (-1 < __fd) {
    __ptr = (void *)0x0;
    iVar1 = open(args[2],0x241,0x1b0);
    if (-1 < iVar1) {
      __ptr = malloc(info.st_size);
      if (__ptr != (void *)0x0) {
        uVar6 = info.st_size & 0xffffffff;
        __buf = __ptr;
        while (iVar5 = (int)uVar6, __buf_00 = __ptr, iVar5 != 0) {
          sVar3 = read(__fd,__buf,(long)iVar5);
          uVar2 = (uint)sVar3;
          if ((int)uVar2 < 0) goto LAB_00104f47;
          if (uVar2 == 0) break;
          __buf = (void *)((long)__buf + (ulong)(uVar2 & 0x7fffffff));
          uVar6 = (ulong)(iVar5 - uVar2);
        }
        do {
          iVar5 = (int)info.st_size;
          if (iVar5 == 0) goto LAB_00104f41;
          sVar3 = write(iVar1,__buf_00,(long)iVar5);
          uVar2 = (uint)sVar3;
          if ((int)uVar2 < 0) goto LAB_00104f47;
          if (uVar2 == 0) goto LAB_00104f41;
          info.st_size = (__off_t)(iVar5 - uVar2);
          __buf_00 = (void *)((long)__buf_00 + (ulong)(uVar2 & 0x7fffffff));
        } while( true );
      }
      __ptr = (void *)0x0;
    }
  }
LAB_00104f47:
  free(__ptr);
  if (-1 < __fd) {
    close(__fd);
  }
  if (-1 < iVar1) {
    close(iVar1);
  }
  return iVar4;
LAB_00104f41:
  iVar4 = 0;
  goto LAB_00104f47;
}

Assistant:

int do_copy(int nargs, char **args)
{
    char *buffer = NULL;
    int rc = 0;
    int fd1 = -1, fd2 = -1;
    struct stat info;
    int brtw, brtr;
    char *p;

    if (nargs != 3)
        return -1;

    if (stat(args[1], &info) < 0) 
        return -1;

    if ((fd1 = open(args[1], O_RDONLY)) < 0) 
        goto out_err;

    if ((fd2 = open(args[2], O_WRONLY|O_CREAT|O_TRUNC, 0660)) < 0)
        goto out_err;

    if (!(buffer = malloc(info.st_size)))
        goto out_err;

    p = buffer;
    brtr = info.st_size;
    while(brtr) {
        rc = read(fd1, p, brtr);
        if (rc < 0)
            goto out_err;
        if (rc == 0)
            break;
        p += rc;
        brtr -= rc;
    }

    p = buffer;
    brtw = info.st_size;
    while(brtw) {
        rc = write(fd2, p, brtw);
        if (rc < 0)
            goto out_err;
        if (rc == 0)
            break;
        p += rc;
        brtw -= rc;
    }

    rc = 0;
    goto out;
out_err:
    rc = -1;
out:
    if (buffer)
        free(buffer);
    if (fd1 >= 0)
        close(fd1);
    if (fd2 >= 0)
        close(fd2);
    return rc;
}